

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_parser.cpp
# Opt level: O0

bool __thiscall
dxil_spv::DXILContainerParser::parse_dxil(DXILContainerParser *this,MemoryStream *stream)

{
  undefined8 this_00;
  bool bVar1;
  size_t sVar2;
  uchar *puVar3;
  void *__buf;
  ulong uVar4;
  size_t bitcode_size;
  undefined1 local_58 [8];
  MemoryStream substream;
  undefined1 local_38 [4];
  uint32_t DxilMagicPad;
  ProgramHeader program_header;
  MemoryStream *stream_local;
  DXILContainerParser *this_local;
  
  program_header._16_8_ = stream;
  bVar1 = MemoryStream::read<DXIL::ProgramHeader>(stream,(ProgramHeader *)local_38);
  this_00 = program_header._16_8_;
  if (bVar1) {
    if (program_header.program_version == 0x4c495844) {
      substream.blob_offset._4_4_ = 0x10;
      if (program_header.dxil_magic < 0x10) {
        this_local._7_1_ = false;
      }
      else {
        sVar2 = MemoryStream::get_offset((MemoryStream *)program_header._16_8_);
        bitcode_size = (size_t)program_header.dxil_version;
        MemoryStream::create_substream_bitcode_size
                  ((MemoryStream *)local_58,(MemoryStream *)this_00,
                   (sVar2 + program_header.dxil_magic) - 0x10,bitcode_size);
        sVar2 = MemoryStream::get_size((MemoryStream *)local_58);
        std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::resize
                  (&this->dxil_blob,sVar2);
        puVar3 = std::vector<unsigned_char,_dxil_spv::ThreadLocalAllocator<unsigned_char>_>::data
                           (&this->dxil_blob);
        __buf = (void *)MemoryStream::get_size((MemoryStream *)local_58);
        uVar4 = MemoryStream::read((MemoryStream *)local_58,(int)puVar3,__buf,bitcode_size);
        if ((uVar4 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DXILContainerParser::parse_dxil(MemoryStream &stream)
{
	DXIL::ProgramHeader program_header;
	if (!stream.read(program_header))
		return false;

	if (static_cast<DXIL::FourCC>(program_header.dxil_magic) != DXIL::FourCC::DXIL)
		return false;

	constexpr uint32_t DxilMagicPad = sizeof(DXIL::ProgramHeader) - offsetof(DXIL::ProgramHeader, dxil_magic);

	if (program_header.bitcode_offset < DxilMagicPad)
		return false;

	auto substream = stream.create_substream_bitcode_size(
		stream.get_offset() + program_header.bitcode_offset - DxilMagicPad,
		program_header.bitcode_size);

	dxil_blob.resize(substream.get_size());
	if (!substream.read(dxil_blob.data(), substream.get_size()))
		return false;

	return true;
}